

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvmbcs.cpp
# Opt level: O0

UBool enumToU(UConverterMBCSTable *mbcsTable,int8_t *stateProps,int32_t state,uint32_t offset,
             uint32_t value,UConverterEnumToUCallback *callback,void *context,UErrorCode *pErrorCode
             )

{
  char cVar1;
  int32_t (*paiVar2) [256];
  uint16_t *puVar3;
  UBool UVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int32_t finalOffset_1;
  int32_t finalOffset;
  int32_t action;
  UChar32 c;
  int32_t nextState;
  int32_t entry;
  int32_t limit;
  int32_t b;
  UChar32 anyCodePoints;
  uint16_t *unicodeCodeUnits;
  int32_t *row;
  UChar32 codePoints [32];
  UConverterEnumToUCallback *callback_local;
  uint32_t value_local;
  uint32_t offset_local;
  int32_t state_local;
  int8_t *stateProps_local;
  UConverterMBCSTable *mbcsTable_local;
  
  paiVar2 = mbcsTable->stateTable;
  puVar3 = mbcsTable->unicodeCodeUnits;
  limit = -1;
  entry = ((int)stateProps[state] & 0x38U) << 2;
  if ((((int)stateProps[state] & 0x38U) == 0) && ('?' < stateProps[state])) {
    row._0_4_ = 0xffffffff;
    entry = 1;
  }
  cVar1 = stateProps[state];
  uVar8 = entry;
  codePoints._120_8_ = callback;
  do {
    entry = uVar8;
    if ((int)((((int)cVar1 & 7U) + 1) * 0x20) <= entry) {
      return '\x01';
    }
    uVar8 = paiVar2[state][entry];
    if ((int)uVar8 < 0) {
      uVar6 = uVar8 >> 0x14 & 0xf;
      if (uVar6 == 0) {
        finalOffset = uVar8 & 0xffff;
      }
      else if (uVar6 == 4) {
        finalOffset = (int32_t)puVar3[(int)(offset + (uVar8 & 0xffff))];
        if (0xfffd < (uint)finalOffset) {
          finalOffset = -1;
        }
      }
      else if (uVar6 == 5) {
        iVar7 = offset + (uVar8 & 0xffff);
        iVar9 = iVar7 + 1;
        finalOffset = (int32_t)puVar3[iVar7];
        if (0xd7ff < (uint)finalOffset) {
          if ((uint)finalOffset < 0xdc00) {
            finalOffset = (finalOffset & 0x3ffU) * 0x400 + (uint)puVar3[iVar9] + 0x2400;
          }
          else if (finalOffset == 0xe000) {
            finalOffset = (int32_t)puVar3[iVar9];
          }
          else {
            finalOffset = -1;
          }
        }
      }
      else if (uVar6 == 1) {
        finalOffset = (uVar8 & 0xfffff) + 0x10000;
      }
      else {
        finalOffset = -1;
      }
      codePoints[(long)(int)(entry & 0x1f) + -2] = finalOffset;
      limit = finalOffset & limit;
    }
    else {
      if ((-1 < stateProps[(int)(uVar8 >> 0x18)]) &&
         (UVar4 = enumToU(mbcsTable,stateProps,uVar8 >> 0x18,offset + (uVar8 & 0xffffff),
                          value << 8 | entry,(UConverterEnumToUCallback *)codePoints._120_8_,context
                          ,pErrorCode), UVar4 == '\0')) {
        return '\0';
      }
      codePoints[(long)(int)(entry & 0x1f) + -2] = -1;
    }
    uVar8 = entry + 1;
    if (((uVar8 & 0x1f) == 0) && (-1 < limit)) {
      cVar5 = (*(code *)codePoints._120_8_)(context,value << 8 | entry - 0x1fU,&row);
      if (cVar5 == '\0') {
        return '\0';
      }
      limit = -1;
    }
  } while( true );
}

Assistant:

static UBool
enumToU(UConverterMBCSTable *mbcsTable, int8_t stateProps[],
        int32_t state, uint32_t offset,
        uint32_t value,
        UConverterEnumToUCallback *callback, const void *context,
        UErrorCode *pErrorCode) {
    UChar32 codePoints[32];
    const int32_t *row;
    const uint16_t *unicodeCodeUnits;
    UChar32 anyCodePoints;
    int32_t b, limit;

    row=mbcsTable->stateTable[state];
    unicodeCodeUnits=mbcsTable->unicodeCodeUnits;

    value<<=8;
    anyCodePoints=-1;  /* becomes non-negative if there is a mapping */

    b=(stateProps[state]&0x38)<<2;
    if(b==0 && stateProps[state]>=0x40) {
        /* skip byte sequences with leading zeros because they are not stored in the fromUnicode table */
        codePoints[0]=U_SENTINEL;
        b=1;
    }
    limit=((stateProps[state]&7)+1)<<5;
    while(b<limit) {
        int32_t entry=row[b];
        if(MBCS_ENTRY_IS_TRANSITION(entry)) {
            int32_t nextState=MBCS_ENTRY_TRANSITION_STATE(entry);
            if(stateProps[nextState]>=0) {
                /* recurse to a state with non-ignorable actions */
                if(!enumToU(
                        mbcsTable, stateProps, nextState,
                        offset+MBCS_ENTRY_TRANSITION_OFFSET(entry),
                        value|(uint32_t)b,
                        callback, context,
                        pErrorCode)) {
                    return FALSE;
                }
            }
            codePoints[b&0x1f]=U_SENTINEL;
        } else {
            UChar32 c;
            int32_t action;

            /*
             * An if-else-if chain provides more reliable performance for
             * the most common cases compared to a switch.
             */
            action=MBCS_ENTRY_FINAL_ACTION(entry);
            if(action==MBCS_STATE_VALID_DIRECT_16) {
                /* output BMP code point */
                c=(UChar)MBCS_ENTRY_FINAL_VALUE_16(entry);
            } else if(action==MBCS_STATE_VALID_16) {
                int32_t finalOffset=offset+MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[finalOffset];
                if(c<0xfffe) {
                    /* output BMP code point */
                } else {
                    c=U_SENTINEL;
                }
            } else if(action==MBCS_STATE_VALID_16_PAIR) {
                int32_t finalOffset=offset+MBCS_ENTRY_FINAL_VALUE_16(entry);
                c=unicodeCodeUnits[finalOffset++];
                if(c<0xd800) {
                    /* output BMP code point below 0xd800 */
                } else if(c<=0xdbff) {
                    /* output roundtrip or fallback supplementary code point */
                    c=((c&0x3ff)<<10)+unicodeCodeUnits[finalOffset]+(0x10000-0xdc00);
                } else if(c==0xe000) {
                    /* output roundtrip BMP code point above 0xd800 or fallback BMP code point */
                    c=unicodeCodeUnits[finalOffset];
                } else {
                    c=U_SENTINEL;
                }
            } else if(action==MBCS_STATE_VALID_DIRECT_20) {
                /* output supplementary code point */
                c=(UChar32)(MBCS_ENTRY_FINAL_VALUE(entry)+0x10000);
            } else {
                c=U_SENTINEL;
            }

            codePoints[b&0x1f]=c;
            anyCodePoints&=c;
        }
        if(((++b)&0x1f)==0) {
            if(anyCodePoints>=0) {
                if(!callback(context, value|(uint32_t)(b-0x20), codePoints)) {
                    return FALSE;
                }
                anyCodePoints=-1;
            }
        }
    }
    return TRUE;
}